

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *destinationFileName,
          IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx,void *context)

{
  _Bool isSuccess;
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle;
  int responseCode;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext;
  _Bool uploadSucceeded;
  LOGGER_LOG l_1;
  char *azureBlobSasUri;
  char *uploadCorrelationId;
  LOGGER_LOG l;
  void *pvStack_30;
  IOTHUB_CLIENT_RESULT result;
  void *context_local;
  IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx_local;
  char *destinationFileName_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  pvStack_30 = context;
  context_local = getDataCallbackEx;
  getDataCallbackEx_local = (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX)destinationFileName;
  destinationFileName_local = (char *)iotHubClientHandle;
  if (((iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
      (destinationFileName == (char *)0x0)) ||
     (getDataCallbackEx == (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX)0x0)) {
    uploadCorrelationId = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)uploadCorrelationId != (LOGGER_LOG)0x0) {
      (*(code *)uploadCorrelationId)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                 ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb62,1,
                 "invalid parameters IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle=%p, destinationFileName=%p, getDataCallbackEx=%p"
                 ,destinationFileName_local,getDataCallbackEx_local,context_local);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    azureBlobSasUri = (char *)0x0;
    l_1 = (LOGGER_LOG)0x0;
    IVar1 = IoTHubClient_LL_UploadToBlob_InitializeUpload
                      (iotHubClientHandle->uploadToBlobHandle,destinationFileName,&azureBlobSasUri,
                       (char **)&l_1);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      azureStorageClientHandle =
           IoTHubClient_LL_UploadToBlob_CreateContext
                     (*(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE *)(destinationFileName_local + 0x198),
                      (char *)l_1);
      if (azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb77,1,
                    "Failed creating upload to blob context");
        }
        isSuccess = false;
      }
      else {
        IVar1 = IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks
                          (azureStorageClientHandle,
                           (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX)context_local,pvStack_30)
        ;
        if (IVar1 == IOTHUB_CLIENT_OK) {
          isSuccess = true;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb7e,1,
                      "Failed to upload multiple blocks to Azure blob");
          }
          isSuccess = false;
        }
        IoTHubClient_LL_UploadToBlob_DestroyContext(azureStorageClientHandle);
      }
      responseCode = 400;
      if (isSuccess != false) {
        responseCode = 200;
      }
      IVar1 = IoTHubClient_LL_UploadToBlob_NotifyCompletion
                        (*(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE *)
                          (destinationFileName_local + 0x198),azureBlobSasUri,isSuccess,responseCode
                         ,(char *)0x0);
      if (IVar1 == IOTHUB_CLIENT_OK) {
        l._4_4_ = IOTHUB_CLIENT_ERROR;
        if (isSuccess != false) {
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb8d,1,
                    "Failed completing upload to blob.");
        }
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
      free(azureBlobSasUri);
      free(l_1);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb6d,1,
                  "Failed initializing upload in IoT Hub");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* destinationFileName, IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx, void* context)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (destinationFileName == NULL) ||
        (getDataCallbackEx == NULL)
        )
    {
        LogError("invalid parameters IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle=%p, destinationFileName=%p, getDataCallbackEx=%p", iotHubClientHandle, destinationFileName, getDataCallbackEx);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        char* uploadCorrelationId = NULL;
        char* azureBlobSasUri = NULL;

        if (IoTHubClient_LL_UploadToBlob_InitializeUpload(
                iotHubClientHandle->uploadToBlobHandle, destinationFileName, &uploadCorrelationId, &azureBlobSasUri) != IOTHUB_CLIENT_OK)
        {
            LogError("Failed initializing upload in IoT Hub");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            bool uploadSucceeded;
            IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext = IoTHubClient_LL_UploadToBlob_CreateContext(iotHubClientHandle->uploadToBlobHandle, azureBlobSasUri);

            if (uploadContext == NULL)
            {
                LogError("Failed creating upload to blob context");
                uploadSucceeded = false;
            }
            else
            {
                if (IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks(uploadContext, getDataCallbackEx, context) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed to upload multiple blocks to Azure blob");
                    uploadSucceeded = false;
                }
                else
                {
                    uploadSucceeded = true;
                }

                IoTHubClient_LL_UploadToBlob_DestroyContext(uploadContext);
            }

            if (IoTHubClient_LL_UploadToBlob_NotifyCompletion(
                    iotHubClientHandle->uploadToBlobHandle, uploadCorrelationId, uploadSucceeded,
                    uploadSucceeded ? 200 : 400, NULL) != IOTHUB_CLIENT_OK)
            {
                LogError("Failed completing upload to blob.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = (uploadSucceeded ? IOTHUB_CLIENT_OK : IOTHUB_CLIENT_ERROR); 
            }

            free(uploadCorrelationId);
            free(azureBlobSasUri);
        }
    }

    return result;
}